

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

int setsbf(match *res,int pos,int len,ull num)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (len != 0) {
    bVar1 = (byte)((long)pos % 0x40);
    uVar6 = ~(-1L << ((byte)len & 0x3f));
    uVar5 = uVar6 << (bVar1 & 0x3f);
    uVar4 = (num & uVar6) << (bVar1 & 0x3f);
    lVar3 = (long)(pos / 0x40);
    iVar2 = 0;
    if (((res->a[lVar3] & uVar5 ^ uVar4) & res->m[lVar3]) == 0) {
      res->a[lVar3] = res->a[lVar3] | uVar4;
      res->m[lVar3] = res->m[lVar3] | uVar5;
      iVar2 = 1;
      if (0x40 < len + (int)((long)pos % 0x40)) {
        uVar5 = uVar6 >> (-bVar1 & 0x3f);
        uVar4 = (num & uVar6) >> (-bVar1 & 0x3f);
        iVar2 = 0;
        if (((res->a[lVar3 + 1] & uVar5 ^ uVar4) & res->m[lVar3 + 1]) == 0) {
          res->a[lVar3 + 1] = res->a[lVar3 + 1] | uVar4;
          res->m[lVar3 + 1] = res->m[lVar3 + 1] | uVar5;
          iVar2 = 1;
        }
      }
    }
    return iVar2;
  }
  return 1;
}

Assistant:

int setsbf (struct match *res, int pos, int len, ull num) {
	if (!len)
		return 1;
	int idx = pos / 0x40;
	pos %= 0x40;
	ull m = ((1ull << len) - 1) << pos;
	ull a = (num << pos) & m;
	if ((a & m & res->m[idx]) == (res->a[idx] & m & res->m[idx])) {
		res->a[idx] |= a;
		res->m[idx] |= m;
	} else {
		return 0;
	}
	if (pos + len > 0x40) {
		ull m1 = (((1ull << len) - 1) >> (0x40 - pos));
		ull a1 = (num >> (0x40 - pos)) & m1;
		if ((a1 & m1 & res->m[idx+1]) == (res->a[idx+1] & m1 & res->m[idx+1])) {
			res->a[idx+1] |= a1;
			res->m[idx+1] |= m1;
		} else {
			return 0;
		}
	}
	return 1;
}